

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void ClearInventory(AActor *activator)

{
  AInventory *this;
  player_t *ppVar1;
  bool bVar2;
  PClass *pPVar3;
  undefined8 *puVar4;
  AInventory *pAVar5;
  int i;
  long lVar6;
  
  pAVar5 = (AInventory *)activator;
  if (activator != (AActor *)0x0) {
    while (this = (pAVar5->super_AActor).Inventory.field_0.p, this != (AInventory *)0x0) {
      if ((this->ItemFlags & 0x20) == 0) {
        bVar2 = DObject::IsKindOf((DObject *)this,AAmmo::RegistrationInfo.MyClass);
        if (bVar2) {
          this->Amount = 0;
          pAVar5 = this;
        }
        else {
          (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
        }
      }
      else {
        pPVar3 = DObject::GetClass((DObject *)this);
        pAVar5 = this;
        if (pPVar3 == AHexenArmor::RegistrationInfo.MyClass) {
          this[1].super_AActor.super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
          this[1].super_AActor.super_DThinker.super_DObject.GCNext = (DObject *)0x0;
          this[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
          this[1].super_AActor.super_DThinker.super_DObject.Class = (PClass *)0x0;
        }
      }
    }
    ppVar1 = activator->player;
    if (ppVar1 != (player_t *)0x0) {
      ppVar1->ReadyWeapon = (AWeapon *)0x0;
      ppVar1->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
    }
    return;
  }
  puVar4 = &players;
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    if (playeringame[lVar6] == true) {
      AActor::ClearInventory((AActor *)*puVar4);
    }
    puVar4 = puVar4 + 0x54;
  }
  return;
}

Assistant:

static void ClearInventory (AActor *activator)
{
	if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->ClearInventory();
		}
	}
	else
	{
		activator->ClearInventory();
	}
}